

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsFrameworkOnApple(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  TVar2 = GetType(this);
  if ((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != STATIC_LIBRARY)) {
    return false;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"APPLE",&local_59);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FRAMEWORK",&local_5a);
    bVar1 = GetPropertyAsBool(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::IsFrameworkOnApple() const
{
  return ((this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->GetType() == cmStateEnums::STATIC_LIBRARY) &&
          this->Makefile->IsOn("APPLE") &&
          this->GetPropertyAsBool("FRAMEWORK"));
}